

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O1

int edge_case_tests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  uVar1 = test_json(&Monster,"{ name: \"Monster\", color: \"Green Blue Red Blue\"}",
                    "{\"name\":\"Monster\",\"color\":19}",0,0,0,0x9e);
  uVar2 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 8}",
                    "{\"name\":\"Monster\",\"color\":\"Blue\"}",0,2,0,0xab);
  uVar3 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Green\"}",
                    "{\"name\":\"Monster\",\"color\":2}",0,0,2,0xaf);
  uVar4 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 8}","{\"name\":\"Monster\"}",0,2,4
                    ,0xb3);
  uVar5 = test_json(&Monster,"{ \"name\": \"Monster\", \"testf\":3.0}",
                    "{\"mana\":150,\"hp\":100,\"name\":\"Monster\",\"color\":\"Blue\",\"testbool\":true,\"testhashs32_fnv1\":0,\"testhashu32_fnv1\":0,\"testhashs64_fnv1\":0,\"testhashu64_fnv1\":0,\"testhashs32_fnv1a\":0,\"testhashu32_fnv1a\":0,\"testhashs64_fnv1a\":0,\"testhashu64_fnv1a\":0,\"testf\":3,\"testf2\":3,\"testf3\":0}"
                    ,0,0,8,0xb7);
  uVar6 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Blue\"}",
                    "{\"name\":\"Monster\",\"color\":\"Blue\"}",0,2,0,0xc6);
  uVar7 = test_json(&Monster,"{ \"name\": \"Monster\", \"xcolor\": \"Green\", \"hp\": 42}",
                    "{\"hp\":42,\"name\":\"Monster\"}",0,1,0,0xca);
  uVar8 = test_json(&Monster,"{ \"name\": \"Monster\", \"xcolor\": \"Green\", \"hp\": 42}",
                    "{hp:42,name:\"Monster\"}",0,1,1,0xce);
  uVar9 = test_json(&Monster,
                    "{ \"name\": \"Monster\", \"xcolor\": \"Green\", \"foobar\": { \"a\": [1, 2.0, ], \"a1\": {}, \"b\": null, \"c\":[],  }, \"hp\": 42 }"
                    ,"{\"hp\":42,\"name\":\"Monster\"}",0,1,0,0xd4);
  uVar10 = test_json(&Monster,"{ name: \"Monster\", color: 8}",
                     "{\"name\":\"Monster\",\"color\":\"Blue\"}",0,2,0,0xdc);
  uVar11 = test_json(&Monster,"{ name: \"Monster\", color: Green}",
                     "{\"name\":\"Monster\",\"color\":2}",0,0,2,0xe0);
  uVar12 = test_json(&Monster,"{ name: \"Monster\", color: 8}","{\"name\":\"Monster\"}",0,2,4,0xe4);
  uVar13 = test_json(&Monster,"{ name: \"Monster\"}",
                     "{\"mana\":150,\"hp\":100,\"name\":\"Monster\",\"color\":\"Blue\",\"testbool\":true,\"testhashs32_fnv1\":0,\"testhashu32_fnv1\":0,\"testhashs64_fnv1\":0,\"testhashu64_fnv1\":0,\"testhashs32_fnv1a\":0,\"testhashu32_fnv1a\":0,\"testhashs64_fnv1a\":0,\"testhashu64_fnv1a\":0,\"testf\":314159,\"testf2\":3,\"testf3\":0}"
                     ,0,0,8,0xe8);
  uVar14 = test_json(&Monster,"{ name: \"Monster\", color: Blue}",
                     "{\"name\":\"Monster\",\"color\":\"Blue\"}",0,2,0,0xec);
  uVar15 = test_json(&Monster,"{ name: \"Monster\", xcolor: Green, hp: 42}",
                     "{\"hp\":42,\"name\":\"Monster\"}",0,1,0,0xf0);
  uVar16 = test_json(&Monster,"{ name: \"Monster\", xcolor: Green, hp: 42}",
                     "{hp:42,name:\"Monster\"}",0,1,1,0xf4);
  uVar17 = test_json(&Monster,
                     "{ name: \"Monster\", xcolor: Green, foobar: { a: [1, 2.0, ], a1: {}, b: null, c:[],  }, hp: 42 }"
                     ,"{\"hp\":42,\"name\":\"Monster\"}",0,1,0,0xfa);
  return uVar17 | uVar16 | uVar15 | uVar14 | uVar13 | uVar12 |
                  uVar11 | uVar10 | uVar9 | uVar8 |
                  uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int edge_case_tests(void)
{
    BEGIN_TEST(Monster);
/*
 * Each symbolic value is type coerced and added. One might expect
 * or'ing flags together, but it doesn't work with signed values
 * and floating point target values. We would either need a much
 * more complicated parser or restrict the places where symbols are
 * allowed.
 */
#if 0
    TEST(   "{ name: \"Monster\", color: \"Green Blue Red Blue\"}",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");
#else
#if UQ
    TEST(   "{ name: \"Monster\", color: \"Green Blue Red Blue\"}",
            "{\"name\":\"Monster\",\"color\":19}");
#else
    TEST(   "{ \"name\": \"Monster\", \"color\": \"Green Blue Red Blue\"}",
            "{\"name\":\"Monster\",\"color\":19}");
#endif
#endif

/*
 * If a value is stored, even if default, it is also printed.
 * This option can also be flagged compile time for better performance.
 */
    TEST_FLAGS(flatcc_json_parser_f_force_add, 0,
            "{ \"name\": \"Monster\", \"color\": 8}",
            "{\"name\":\"Monster\",\"color\":\"Blue\"}");

    TEST_FLAGS(0, flatcc_json_printer_f_noenum,
            "{ \"name\": \"Monster\", \"color\": \"Green\"}",
            "{\"name\":\"Monster\",\"color\":2}");

    TEST_FLAGS(flatcc_json_parser_f_force_add, flatcc_json_printer_f_skip_default,
            "{ \"name\": \"Monster\", \"color\": 8}",
            "{\"name\":\"Monster\"}");

    TEST_FLAGS(0, flatcc_json_printer_f_force_default,
            "{ \"name\": \"Monster\", \"testf\":3.0}",
"{\"mana\":150,\"hp\":100,\"name\":\"Monster\",\"color\":\"Blue\",\"testbool\":true,\"testhashs32_fnv1\":0,\"testhashu32_fnv1\":0,\"testhashs64_fnv1\":0,\"testhashu64_fnv1\":0,\"testhashs32_fnv1a\":0,\"testhashu32_fnv1a\":0,\"testhashs64_fnv1a\":0,\"testhashu64_fnv1a\":0,\"testf\":3,\"testf2\":3,\"testf3\":0}");


    /* 
     * Cannot test the default of testf field because float is printed as double with
     * configuration dependent precision.
     */
#if 0 
    TEST_FLAGS(0, flatcc_json_printer_f_force_default,
            "{ \"name\": \"Monster\", \"testf3\":3.14159012}",
"{\"mana\":150,\"hp\":100,\"name\":\"Monster\",\"color\":\"Blue\",\"testbool\":true,\"testhashs32_fnv1\":0,\"testhashu32_fnv1\":0,\"testhashs64_fnv1\":0,\"testhashu64_fnv1\":0,\"testhashs32_fnv1a\":0,\"testhashu32_fnv1a\":0,\"testhashs64_fnv1a\":0,\"testhashu64_fnv1a\":0,\"testf\":3.14159,\"testf2\":3,\"testf3\":0}");
#endif

    TEST_FLAGS(flatcc_json_parser_f_force_add, 0,
            "{ \"name\": \"Monster\", \"color\": \"Blue\"}",
            "{\"name\":\"Monster\",\"color\":\"Blue\"}");

    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, 0,
            "{ \"name\": \"Monster\", \"xcolor\": \"Green\", \"hp\": 42}",
            "{\"hp\":42,\"name\":\"Monster\"}");

    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, flatcc_json_printer_f_unquote,
            "{ \"name\": \"Monster\", \"xcolor\": \"Green\", \"hp\": 42}",
            "{hp:42,name:\"Monster\"}");

    /* Also test generic parser used with unions with late type field. */
    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, 0,
            "{ \"name\": \"Monster\", \"xcolor\": \"Green\", "
            "\"foobar\": { \"a\": [1, 2.0, ], \"a1\": {}, \"b\": null, \"c\":[],  }, \"hp\": 42 }",
            "{\"hp\":42,\"name\":\"Monster\"}");
#if UQ
/*
 * If a value is stored, even if default, it is also printed.
 * This option can also be flagged compile time for better performance.
 */
    TEST_FLAGS(flatcc_json_parser_f_force_add, 0,
            "{ name: \"Monster\", color: 8}",
            "{\"name\":\"Monster\",\"color\":\"Blue\"}");

    TEST_FLAGS(0, flatcc_json_printer_f_noenum,
            "{ name: \"Monster\", color: Green}",
            "{\"name\":\"Monster\",\"color\":2}");

    TEST_FLAGS(flatcc_json_parser_f_force_add, flatcc_json_printer_f_skip_default,
            "{ name: \"Monster\", color: 8}",
            "{\"name\":\"Monster\"}");

    TEST_FLAGS(0, flatcc_json_printer_f_force_default,
            "{ name: \"Monster\"}",
"{\"mana\":150,\"hp\":100,\"name\":\"Monster\",\"color\":\"Blue\",\"testbool\":true,\"testhashs32_fnv1\":0,\"testhashu32_fnv1\":0,\"testhashs64_fnv1\":0,\"testhashu64_fnv1\":0,\"testhashs32_fnv1a\":0,\"testhashu32_fnv1a\":0,\"testhashs64_fnv1a\":0,\"testhashu64_fnv1a\":0,\"testf\":314159,\"testf2\":3,\"testf3\":0}");

    TEST_FLAGS(flatcc_json_parser_f_force_add, 0,
            "{ name: \"Monster\", color: Blue}",
            "{\"name\":\"Monster\",\"color\":\"Blue\"}");

    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, 0,
            "{ name: \"Monster\", xcolor: Green, hp: 42}",
            "{\"hp\":42,\"name\":\"Monster\"}");

    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, flatcc_json_printer_f_unquote,
            "{ name: \"Monster\", xcolor: Green, hp: 42}",
            "{hp:42,name:\"Monster\"}");

    /* Also test generic parser used with unions with late type field. */
    TEST_FLAGS(flatcc_json_parser_f_skip_unknown, 0,
            "{ name: \"Monster\", xcolor: Green, "
            "foobar: { a: [1, 2.0, ], a1: {}, b: null, c:[],  }, hp: 42 }",
            "{\"hp\":42,\"name\":\"Monster\"}");
#endif

/* Without skip unknown, we should expect failure. */
#if 0
    TEST(   "{ name: \"Monster\", xcolor: Green}",
            "{\"name\":\"Monster\"}");
#endif

/* We do not support null. */
#if 0
    TEST(
            "{ name: \"Monster\", test_type: null }",
            "{\"name\":\"Monster\"}");
#endif

/*
 * We do not allow empty flag strings because they might mean
 * either default value, or 0.
 */
#if 0
    /* Questionable if this really is an error. */
    TEST(   "{ name: \"Monster\", color: \"\"}",
            "{\"name\":\"Monster\",\"color\":0}"); // TODO: should this be color:"" ?

    TEST(   "{ name: \"Monster\", color: \" \"}",
            "{\"name\":\"Monster\",\"color\":0}");

#endif

    END_TEST();
}